

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

SpecialName * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::SpecialName,char_const(&)[34],(anonymous_namespace)::Node*&>
          (Db *this,char (*args) [34],Node **args_1)

{
  Node *pNVar1;
  SpecialName *pSVar2;
  size_t sVar3;
  
  pSVar2 = (SpecialName *)
           anon_unknown.dwarf_18d51b::BumpPointerAllocator::allocate
                     ((BumpPointerAllocator *)(this + 0x2f0),0x28);
  sVar3 = strlen(*args);
  pNVar1 = *args_1;
  (pSVar2->super_Node).K = KSpecialName;
  (pSVar2->super_Node).RHSComponentCache = No;
  (pSVar2->super_Node).ArrayCache = No;
  (pSVar2->super_Node).FunctionCache = No;
  (pSVar2->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00184660;
  (pSVar2->Special).First = *args;
  (pSVar2->Special).Last = *args + sVar3;
  pSVar2->Child = pNVar1;
  return pSVar2;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }